

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

bool __thiscall pbrt::syntactic::ParamSet::getParam2f(ParamSet *this,float *result,string *name)

{
  _Base_ptr this_00;
  float *pfVar1;
  const_iterator cVar2;
  long *plVar3;
  long lVar4;
  runtime_error *prVar5;
  long *plVar6;
  _Rb_tree_header *p_Var7;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                  *)this,name);
  p_Var7 = &(this->param)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node == p_Var7) {
LAB_0012608b:
    return (_Rb_tree_header *)cVar2._M_node != p_Var7;
  }
  lVar4 = *(long *)(cVar2._M_node + 2);
  this_00 = cVar2._M_node[2]._M_parent;
  if (this_00 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
    }
  }
  if (lVar4 != 0) {
    plVar3 = (long *)__dynamic_cast(lVar4,&Param::typeinfo,&ParamArray<float>::typeinfo,0);
    if (plVar3 != (long *)0x0) {
      if (this_00 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
      }
      lVar4 = (**(code **)(*plVar3 + 8))(plVar3);
      if (lVar4 != 2) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,
                       "found param of given name and type, but wrong number of components! (2f, name=\'"
                       ,name);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70 = (long *)*plVar3;
        plVar6 = plVar3 + 2;
        if (local_70 == plVar6) {
          local_60 = *plVar6;
          lStack_58 = plVar3[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar6;
        }
        local_68 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::runtime_error::runtime_error(prVar5,(string *)&local_70);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pfVar1 = (float *)plVar3[3];
      *result = *pfVar1;
      result[1] = pfVar1[1];
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      goto LAB_0012608b;
    }
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"found param of given name, but of wrong type! (name was \'",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar3;
  plVar6 = plVar3 + 2;
  if (local_70 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(prVar5,(string *)&local_70);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ParamSet::getParam2f(float *result, const std::string &name) const
    {
      std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.find(name);
      if (it == param.end())
        return 0;
      std::shared_ptr<Param> pr = it->second;
      const std::shared_ptr<ParamArray<float>> p = std::dynamic_pointer_cast<ParamArray<float>>(pr);
      if (!p)
        throw std::runtime_error("found param of given name, but of wrong type! (name was '"+name+"'");
      if (p->getSize() != 2)
        throw std::runtime_error("found param of given name and type, but wrong number of components! (2f, name='"+name+"'");
      result[0] = p->get(0);
      result[1] = p->get(1);
      return true;
    }